

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

void __thiscall
sqlite_orm::internal::storage_base::perform_query_without_result
          (storage_base *this,string *query,sqlite3 *db)

{
  int iVar1;
  uint uVar2;
  system_error *psVar3;
  error_category *peVar4;
  char *pcVar5;
  error_code __ec;
  error_code __ec_00;
  sqlite3_stmt *stmt;
  undefined8 local_30;
  
  iVar1 = sqlite3_prepare_v2(db,(query->_M_dataplus)._M_p,0xffffffff,&local_30,0);
  if (iVar1 != 0) {
    psVar3 = (system_error *)__cxa_allocate_exception(0x20);
    uVar2 = sqlite3_errcode(db);
    peVar4 = &get_sqlite_error_category()->super_error_category;
    pcVar5 = (char *)sqlite3_errmsg(db);
    __ec._4_4_ = 0;
    __ec._M_value = uVar2;
    __ec._M_cat = peVar4;
    std::system_error::system_error(psVar3,__ec,pcVar5);
    __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  iVar1 = sqlite3_step(local_30);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_30);
    return;
  }
  psVar3 = (system_error *)__cxa_allocate_exception(0x20);
  uVar2 = sqlite3_errcode(db);
  peVar4 = &get_sqlite_error_category()->super_error_category;
  pcVar5 = (char *)sqlite3_errmsg(db);
  __ec_00._4_4_ = 0;
  __ec_00._M_value = uVar2;
  __ec_00._M_cat = peVar4;
  std::system_error::system_error(psVar3,__ec_00,pcVar5);
  __cxa_throw(psVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void perform_query_without_result(const std::string &query, sqlite3 *db) {
        sqlite3_stmt *stmt;
        if(sqlite3_prepare_v2(db, query.c_str(), -1, &stmt, nullptr) == SQLITE_OK) {
            statement_finalizer finalizer{stmt};
            if(sqlite3_step(stmt) == SQLITE_DONE) {
                //  done..
            } else {
                throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                        sqlite3_errmsg(db));
            }
        } else {
            throw std::system_error(std::error_code(sqlite3_errcode(db), get_sqlite_error_category()),
                                    sqlite3_errmsg(db));
        }
    }